

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  FILE *__stream;
  in_addr __in;
  uint uVar2;
  int __fd;
  int iVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  char *__s;
  byte bVar10;
  long lVar11;
  bool bVar12;
  size_t sStackY_480;
  sockaddr_in sin;
  char buf [1024];
  
  __in.s_addr = 0x100007f;
  if (((1 < argc) && (__in.s_addr = inet_addr(argv[1]), argc != 2)) &&
     (username = argv[2], 3 < (uint)argc)) {
    password = argv[3];
  }
  uVar2 = libssh2_init(0);
  if (uVar2 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar2);
    return 1;
  }
  __fd = socket(2,1,0);
  __stream = _stderr;
  if (__fd == -1) {
    fwrite("failed to create socket.\n",0x19,1,_stderr);
    uVar2 = 1;
    goto LAB_00102a18;
  }
  sin.sin_family = 2;
  sin.sin_port = 0x1600;
  sin.sin_addr.s_addr = __in.s_addr;
  pcVar4 = inet_ntoa(__in);
  fprintf(__stream,"Connecting to %s:%d as user %s\n",pcVar4,0x16,username);
  iVar3 = connect(__fd,(sockaddr *)&sin,0x10);
  if (iVar3 == 0) {
    lVar5 = libssh2_session_init_ex(0,0,0,0);
    if (lVar5 == 0) {
      pcVar4 = "Could not initialize SSH session.\n";
      sStackY_480 = 0x22;
      goto LAB_001024b8;
    }
    libssh2_trace(lVar5,0xffffffffffffffff);
    uVar2 = libssh2_session_handshake(lVar5,__fd);
    if (uVar2 == 0) {
      lVar6 = libssh2_hostkey_hash(lVar5,2);
      fwrite("Fingerprint: ",0xd,1,_stderr);
      for (lVar11 = 0; lVar11 != 0x14; lVar11 = lVar11 + 1) {
        fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar6 + lVar11));
      }
      fputc(10,_stderr);
      pcVar4 = username;
      sVar7 = strlen(username);
      pcVar4 = (char *)libssh2_userauth_list(lVar5,pcVar4,sVar7 & 0xffffffff);
      if (pcVar4 == (char *)0x0) {
LAB_00102743:
        lVar6 = libssh2_channel_open_ex(lVar5,"session",7,0x200000,0x8000,0,0);
        if (lVar6 == 0) {
          pcVar4 = "Unable to open a session\n";
          sStackY_480 = 0x19;
          goto LAB_001029d2;
        }
        libssh2_channel_setenv_ex(lVar6,"FOO",3,"bar",3);
        if (5 < argc) {
          pcVar4 = argv[5];
          sVar7 = strlen(pcVar4);
          iVar3 = libssh2_channel_process_startup(lVar6,"exec",4,pcVar4,sVar7 & 0xffffffff);
          if (iVar3 != 0) {
            fwrite("Unable to request command on channel\n",0x25,1,_stderr);
            goto LAB_001029df;
          }
          while (iVar3 = libssh2_channel_eof(lVar6), iVar3 == 0) {
            sVar7 = libssh2_channel_read_ex(lVar6,0,buf,0x400);
            if ((long)sVar7 < 0) {
              fprintf(_stderr,"Unable to read response: %ld\n");
            }
            else {
              fwrite(buf,1,sVar7,_stdout);
            }
          }
        }
        uVar2 = libssh2_channel_get_exit_status(lVar6);
        iVar3 = libssh2_channel_close(lVar6);
        if (iVar3 != 0) {
          fwrite("Unable to close channel\n",0x18,1,_stderr);
        }
        libssh2_channel_free(lVar6);
      }
      else {
        fprintf(_stderr,"Authentication methods: %s\n",pcVar4);
        pcVar8 = strstr(pcVar4,"password");
        bVar12 = pcVar8 != (char *)0x0;
        pcVar8 = strstr(pcVar4,"keyboard-interactive");
        bVar1 = bVar12 + 2;
        if (pcVar8 == (char *)0x0) {
          bVar1 = bVar12;
        }
        pcVar8 = strstr(pcVar4,"publickey");
        pcVar4 = username;
        bVar10 = bVar1 + 4;
        if (pcVar8 == (char *)0x0) {
          bVar10 = bVar1;
        }
        if (4 < argc) {
          if (((bVar12) && (pcVar8 = argv[4], *pcVar8 == '-')) &&
             ((pcVar8[1] == 'p' && (pcVar8[2] == '\0')))) {
            bVar10 = 0;
            bVar12 = true;
          }
          if ((((bVar10 & 2) != 0) && (pcVar8 = argv[4], *pcVar8 == '-')) &&
             ((pcVar8[1] == 'i' && (pcVar8[2] == '\0')))) {
            bVar10 = 2;
            bVar12 = false;
          }
          if (((((bVar10 & 4) != 0) && (pcVar8 = argv[4], *pcVar8 == '-')) && (pcVar8[1] == 'k')) &&
             (pcVar8[2] == '\0')) {
            bVar10 = 4;
            bVar12 = false;
          }
        }
        if (bVar12) {
          sVar7 = strlen(username);
          pcVar8 = password;
          sVar9 = strlen(password);
          iVar3 = libssh2_userauth_password_ex
                            (lVar5,pcVar4,sVar7 & 0xffffffff,pcVar8,sVar9 & 0xffffffff,0);
          if (iVar3 == 0) {
            pcVar4 = "Authentication by password succeeded.\n";
            sStackY_480 = 0x26;
LAB_0010273a:
            fwrite(pcVar4,sStackY_480,1,_stderr);
            goto LAB_00102743;
          }
          pcVar4 = "Authentication by password failed.\n";
          sStackY_480 = 0x23;
LAB_001029d2:
          fwrite(pcVar4,sStackY_480,1,_stderr);
        }
        else {
          if ((bVar10 & 2) != 0) {
            sVar7 = strlen(username);
            iVar3 = libssh2_userauth_keyboard_interactive_ex
                              (lVar5,pcVar4,sVar7 & 0xffffffff,kbd_callback);
            if (iVar3 == 0) {
              pcVar4 = "Authentication by keyboard-interactive succeeded.\n";
              sStackY_480 = 0x32;
              goto LAB_0010273a;
            }
            pcVar4 = "Authentication by keyboard-interactive failed.\n";
            sStackY_480 = 0x2f;
            goto LAB_001029d2;
          }
          uVar2 = 1;
          if ((bVar10 & 4) == 0) {
            fwrite("No supported authentication methods found.\n",0x2b,1,_stderr);
            goto LAB_001029e3;
          }
          pcVar4 = getenv("HOME");
          if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
            pcVar4 = ".";
          }
          sVar7 = strlen(pcVar4);
          pcVar8 = (char *)malloc(sVar7 + 0x11);
          __s = (char *)malloc(sVar7 + 0xd);
          if (pcVar8 == (char *)0x0 || __s == (char *)0x0) {
            free(__s);
            free(pcVar8);
            fwrite("out of memory\n",0xe,1,_stderr);
          }
          else {
            snprintf(pcVar8,sVar7 + 0x11,"%s/%s",pcVar4,".ssh/id_rsa.pub");
            snprintf(__s,sVar7 + 0xd,"%s/%s",pcVar4,".ssh/id_rsa");
            pcVar4 = username;
            sVar7 = strlen(username);
            iVar3 = libssh2_userauth_publickey_fromfile_ex
                              (lVar5,pcVar4,sVar7 & 0xffffffff,pcVar8,__s,password);
            if (iVar3 == 0) {
              fwrite("Authentication by public key succeeded.\n",0x28,1,_stderr);
              free(__s);
              free(pcVar8);
              goto LAB_00102743;
            }
            fwrite("Authentication by public key failed.\n",0x25,1,_stderr);
            free(__s);
            free(pcVar8);
          }
        }
LAB_001029df:
        uVar2 = 1;
      }
    }
    else {
      fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar2);
    }
LAB_001029e3:
    libssh2_session_disconnect_ex(lVar5,0xb,"Normal Shutdown","");
    libssh2_session_free(lVar5);
  }
  else {
    pcVar4 = "failed to connect.\n";
    sStackY_480 = 0x13;
LAB_001024b8:
    uVar2 = 0;
    fwrite(pcVar4,sStackY_480,1,_stderr);
  }
  shutdown(__fd,2);
  close(__fd);
LAB_00102a18:
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return uVar2;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 0;
    struct sockaddr_in sin;
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        rc = 1;
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;

    fprintf(stderr, "Connecting to %s:%d as user %s\n",
            inet_ntoa(sin.sin_addr), ntohs(sin.sin_port), username);

    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance and start it up. This will trade welcome
     * banners, exchange keys, and setup crypto, compression, and MAC layers
     */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* Enable all debugging when libssh2 was built with debugging enabled */
    libssh2_trace(session, ~0);

    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    rc = 1;

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(strstr(userauthlist, "password")) {
            auth_pw |= 1;
        }
        if(strstr(userauthlist, "keyboard-interactive")) {
            auth_pw |= 2;
        }
        if(strstr(userauthlist, "publickey")) {
            auth_pw |= 4;
        }

        /* check for options */
        if(argc > 4) {
            if((auth_pw & 1) && !strcmp(argv[4], "-p")) {
                auth_pw = 1;
            }
            if((auth_pw & 2) && !strcmp(argv[4], "-i")) {
                auth_pw = 2;
            }
            if((auth_pw & 4) && !strcmp(argv[4], "-k")) {
                auth_pw = 4;
            }
        }

        if(auth_pw & 1) {
            /* We could authenticate via password */
            if(libssh2_userauth_password(session, username, password)) {
                fprintf(stderr, "Authentication by password failed.\n");
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by password succeeded.\n");
            }
        }
        else if(auth_pw & 2) {
            /* Or via keyboard-interactive */
            if(libssh2_userauth_keyboard_interactive(session, username,
                                                     &kbd_callback) ) {
                fprintf(stderr,
                        "Authentication by keyboard-interactive failed.\n");
                goto shutdown;
            }
            else {
                fprintf(stderr,
                        "Authentication by keyboard-interactive succeeded.\n");
            }
        }
        else if(auth_pw & 4) {
            /* Or by public key */
            size_t fn1sz, fn2sz;
            char *fn1, *fn2;
            char const *h = getenv("HOME");
            if(!h || !*h)
                h = ".";
            fn1sz = strlen(h) + strlen(pubkey) + 2;
            fn2sz = strlen(h) + strlen(privkey) + 2;
            fn1 = malloc(fn1sz);
            fn2 = malloc(fn2sz);
            if(!fn1 || !fn2) {
                free(fn2);
                free(fn1);
                fprintf(stderr, "out of memory\n");
                goto shutdown;
            }
            /* Avoid false positives */
#if defined(__GNUC__) && __GNUC__ >= 7
#pragma GCC diagnostic push
#pragma GCC diagnostic warning "-Wformat-truncation=1"
#endif
            /* Using asprintf() here would be much cleaner,
               but less portable */
            snprintf(fn1, fn1sz, "%s/%s", h, pubkey);
            snprintf(fn2, fn2sz, "%s/%s", h, privkey);
#if defined(__GNUC__) && __GNUC__ >= 7
#pragma GCC diagnostic pop
#endif

            if(libssh2_userauth_publickey_fromfile(session, username,
                                                   fn1, fn2,
                                                   password)) {
                fprintf(stderr, "Authentication by public key failed.\n");
                free(fn2);
                free(fn1);
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by public key succeeded.\n");
            }
            free(fn2);
            free(fn1);
        }
        else {
            fprintf(stderr, "No supported authentication methods found.\n");
            goto shutdown;
        }
    }

    /* Request a session channel on which to run a shell */
    channel = libssh2_channel_open_session(session);
    if(!channel) {
        fprintf(stderr, "Unable to open a session\n");
        goto shutdown;
    }

    /* Some environment variables may be set,
     * It's up to the server which ones it'll allow though
     */
    libssh2_channel_setenv(channel, "FOO", "bar");

    /* Request a terminal with 'vanilla' terminal emulation
     * See /etc/termcap for more options. This is useful when opening
     * an interactive shell.
     */
    #if 0
    if(libssh2_channel_request_pty(channel, "vanilla")) {
        fprintf(stderr, "Failed requesting pty\n");
    }
    #endif

    if(argc > 5) {
        if(libssh2_channel_exec(channel, argv[5])) {
            fprintf(stderr, "Unable to request command on channel\n");
            goto shutdown;
        }
        /* Instead of just running a single command with libssh2_channel_exec,
         * a shell can be opened on the channel instead, for interactive use.
         * You usually want a pty allocated first in that case (see above). */
        #if 0
        if(libssh2_channel_shell(channel)) {
            fprintf(stderr, "Unable to request shell on allocated pty\n");
            goto shutdown;
        }
        #endif

        /* At this point the shell can be interacted with using
         * libssh2_channel_read()
         * libssh2_channel_read_stderr()
         * libssh2_channel_write()
         * libssh2_channel_write_stderr()
         *
         * Blocking mode may be (en|dis)abled with:
         *    libssh2_channel_set_blocking()
         * If the server send EOF, libssh2_channel_eof() will return non-0
         * To send EOF to the server use: libssh2_channel_send_eof()
         * A channel can be closed with: libssh2_channel_close()
         * A channel can be freed with: libssh2_channel_free()
         */

        /* Read and display all the data received on stdout (ignoring stderr)
         * until the channel closes. This will eventually block if the command
         * produces too much data on stderr; the loop must be rewritten to use
         * non-blocking mode and include interspersed calls to
         * libssh2_channel_read_stderr() to avoid this. See ssh2_echo.c for
         * an idea of how such a loop might look.
         */
        while(!libssh2_channel_eof(channel)) {
            char buf[1024];
            ssize_t err = libssh2_channel_read(channel, buf, sizeof(buf));
            if(err < 0)
                fprintf(stderr, "Unable to read response: %ld\n", (long)err);
            else {
                fwrite(buf, 1, (size_t)err, stdout);
            }
        }
    }

    rc = libssh2_channel_get_exit_status(channel);

    if(libssh2_channel_close(channel))
        fprintf(stderr, "Unable to close channel\n");

    if(channel) {
        libssh2_channel_free(channel);
        channel = NULL;
    }

    /* Other channel types are supported via:
     * libssh2_scp_send64()
     * libssh2_scp_recv2()
     * libssh2_channel_direct_tcpip()
     */

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return rc;
}